

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

ostream * __thiscall nivalis::Function::to_bin(Function *this,ostream *os)

{
  pointer pEVar1;
  size_t i_1;
  ulong uVar2;
  int i;
  long lVar3;
  
  util::write_bin<unsigned_long>(os,(this->name)._M_string_length);
  std::ostream::write((char *)os,(long)(this->name)._M_dataplus._M_p);
  util::write_bin<int>(os,this->type);
  util::write_bin<unsigned_long>(os,(this->expr_str)._M_string_length);
  std::ostream::write((char *)os,(long)(this->expr_str)._M_dataplus._M_p);
  Expr::to_bin(&this->expr,os);
  Expr::to_bin(&this->diff,os);
  Expr::to_bin(&this->ddiff,os);
  Expr::to_bin(&this->recip,os);
  Expr::to_bin(&this->drecip,os);
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    util::write_bin<float>(os,(this->line_color).data[lVar3]);
  }
  util::write_bin<float>(os,this->tmin);
  util::write_bin<float>(os,this->tmax);
  util::write_bin<unsigned_long>
            (os,((long)(this->exprs).
                       super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->exprs).
                      super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x18);
  lVar3 = 0;
  for (uVar2 = 0;
      pEVar1 = (this->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(this->exprs).
                             super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pEVar1) / 0x18);
      uVar2 = uVar2 + 1) {
    Expr::to_bin((Expr *)((long)&(pEVar1->ast).
                                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                 ._M_impl + lVar3),os);
    lVar3 = lVar3 + 0x18;
  }
  util::write_bin<unsigned_long>(os,(this->str)._M_string_length);
  std::ostream::write((char *)os,(long)(this->str)._M_dataplus._M_p);
  return os;
}

Assistant:

std::ostream& Function::to_bin(std::ostream& os) const {
    util::write_bin(os, name.size());
    os.write(name.c_str(), name.size());
    util::write_bin(os, type);
    util::write_bin(os, expr_str.size());
    os.write(expr_str.c_str(), expr_str.size());

    expr.to_bin(os); diff.to_bin(os);
    ddiff.to_bin(os); recip.to_bin(os);
    drecip.to_bin(os);
    for (int i = 0; i < 4; ++i) util::write_bin(os, line_color.data[i]);
    util::write_bin(os, tmin);
    util::write_bin(os, tmax);

    util::write_bin(os, exprs.size());
    for (size_t i = 0; i < exprs.size(); ++i) {
        exprs[i].to_bin(os);
    }

    util::write_bin(os, str.size());
    os.write(str.c_str(), str.size());
    return os;
}